

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O0

size_t io::
       read_all<io::read_only<io::basic_string_stream<char,std::char_traits<char>>>,io::net::dynamic_string_buffer<char,std::char_traits<char>,std::allocator<char>>,void>
                 (read_only<io::basic_string_stream<char,_std::char_traits<char>_>_> *stream,
                 dynamic_string_buffer<char,_std::char_traits<char>,_std::allocator<char>_> *b)

{
  bool bVar1;
  size_t sVar2;
  system_error *this;
  error_code __ec;
  size_t bytes_read;
  error_code ec;
  dynamic_string_buffer<char,_std::char_traits<char>,_std::allocator<char>_> *b_local;
  read_only<io::basic_string_stream<char,_std::char_traits<char>_>_> *stream_local;
  
  ec._M_cat = (error_category *)b;
  std::error_code::error_code((error_code *)&bytes_read);
  sVar2 = read_all<io::read_only<io::basic_string_stream<char,std::char_traits<char>>>,io::net::dynamic_string_buffer<char,std::char_traits<char>,std::allocator<char>>,void>
                    (stream,(dynamic_string_buffer<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)ec._M_cat,(error_code *)&bytes_read);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&bytes_read);
  if (!bVar1) {
    return sVar2;
  }
  this = (system_error *)__cxa_allocate_exception(0x20);
  __ec._0_8_ = bytes_read & 0xffffffff;
  __ec._M_cat = (error_category *)ec._0_8_;
  std::system_error::system_error(this,__ec);
  __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

std::size_t read_all(SyncReadStream& stream, DynamicBuffer&& b)
{
    std::error_code ec;
    std::size_t bytes_read = io::read_all(stream, std::forward<DynamicBuffer>(b), ec);
    if (ec) {
        throw std::system_error{ec};
    }
    return bytes_read;
}